

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void qemu_ram_free_riscv64(uc_struct_conflict13 *uc,RAMBlock *block)

{
  RAMBlock *block_local;
  uc_struct_conflict13 *uc_local;
  
  if (block != (RAMBlock *)0x0) {
    if ((block->next).le_next != (RAMBlock *)0x0) {
      (((block->next).le_next)->next).le_prev = (block->next).le_prev;
    }
    *(block->next).le_prev = (block->next).le_next;
    (uc->ram_list).mru_block = (RAMBlock *)0x0;
    (uc->ram_list).freed = true;
    reclaim_ramblock(uc,block);
  }
  return;
}

Assistant:

void qemu_ram_free(struct uc_struct *uc, RAMBlock *block)
{
    if (!block) {
        return;
    }

    //if (block->host) {
    //    ram_block_notify_remove(block->host, block->max_length);
    //}

    QLIST_REMOVE_RCU(block, next);
    uc->ram_list.mru_block = NULL;
    uc->ram_list.freed = true;
    /* Write list before version */
    //smp_wmb();
    // call_rcu(block, reclaim_ramblock, rcu);
    reclaim_ramblock(uc, block);
}